

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  FailureReporterInterface *pFVar1;
  LogSeverity severity;
  
  if (reaction == kDefault) {
    severity = kWarning;
  }
  else {
    if (reaction != kAllow) {
      pFVar1 = GetFailureReporter();
      (*pFVar1->_vptr_FailureReporterInterface[2])
                (pFVar1,0,0,0xffffffff,msg,pFVar1->_vptr_FailureReporterInterface[2]);
      return;
    }
    severity = kInfo;
  }
  Log(severity,msg,3);
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const string& msg) {
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, 3);
      break;
    case kWarn:
      Log(kWarning, msg, 3);
      break;
    default:  // FAIL
      Expect(false, NULL, -1, msg);
  }
}